

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::PatternMatcher::checkPatternsMatches(PatternMatcher *this)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  
  p_Var5 = (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->patterns)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->patternsMatched)._M_t,(key_type *)(p_Var5 + 1));
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(this->patternsMatched)._M_t._M_impl.super__Rb_tree_header) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning: Asyncify ",0x12);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->designation)._M_dataplus._M_p,
                            (this->designation)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"list contained a non-matching pattern: ",0x27);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->unescaped,(key_type *)(p_Var5 + 1));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  return;
}

Assistant:

void checkPatternsMatches() {
    for (auto& pattern : patterns) {
      if (patternsMatched.count(pattern) == 0) {
        std::cerr << "warning: Asyncify " << designation
                  << "list contained a non-matching pattern: "
                  << unescaped[pattern] << " (" << pattern << ")\n";
      }
    }
  }